

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_shape_fitting.hpp
# Opt level: O2

vector<float,_std::allocator<float>_> *
eos::fitting::fit_shape_to_landmarks_linear
          (vector<float,_std::allocator<float>_> *__return_storage_ptr__,PcaModel *shape_model,
          Matrix<float,_3,_4,_0,_3,_4> *affine_camera_matrix,
          vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
          *landmarks,vector<int,_std::allocator<int>_> *vertex_ids,VectorXf *base_face,float lambda,
          optional<int> num_coefficients_to_fit,optional<float> detector_standard_deviation,
          optional<float> model_standard_deviation)

{
  Scalar SVar1;
  double dVar2;
  ulong uVar3;
  vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
  *pvVar4;
  undefined1 auVar5 [16];
  Scalar *pSVar6;
  Scalar *pSVar7;
  long cols;
  long row;
  int y_1;
  long col;
  int i;
  ulong uVar8;
  long lVar9;
  double dVar10;
  float lambda_local;
  long local_290;
  ulong local_288;
  vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
  *local_280;
  long local_278;
  VectorXf c_s;
  VectorXf v_bar;
  VectorXf y;
  vector<Eigen::Triplet<float,_int>,_std::allocator<Eigen::Triplet<float,_int>_>_> P_coefficients;
  MatrixXf V_hat_h;
  MatrixXf rhs;
  VectorXf Omega;
  IdentityReturnType local_190;
  MatrixXf AtOmegaAReg;
  MatrixXf b;
  MatrixXf A;
  undefined1 local_130 [152];
  PlainObjectBase<Eigen::Matrix<float,_1,1,0,_1,1>> *local_98;
  PlainObjectBase<Eigen::Matrix<float,_1,_1,0,_1,_1>> *local_90;
  Product<Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>
  local_88;
  SparseMatrix<float,_0,_int> P;
  
  uVar8 = (long)(landmarks->
                super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(landmarks->
                super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                )._M_impl.super__Vector_impl_data._M_start >> 3;
  lambda_local = lambda;
  if (uVar8 == (long)(vertex_ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(vertex_ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start >> 2) {
    if (((ulong)num_coefficients_to_fit.super__Optional_base<int,_true,_true>._M_payload.
                super__Optional_payload_base<int> >> 0x20 & 1) == 0) {
      num_coefficients_to_fit.super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int> =
           (_Optional_base<int,_true,_true>)
           (shape_model->rescaled_pca_basis).
           super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_cols;
    }
    local_280 = landmarks;
    if ((base_face->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).m_storage.m_rows
        == 0) {
      Eigen::internal::
      call_assignment<Eigen::Matrix<float,_1,1,0,_1,1>,Eigen::Matrix<float,_1,1,0,_1,1>>
                (base_face,&shape_model->mean);
    }
    local_290 = (long)((int)uVar8 * 4);
    cols = (long)num_coefficients_to_fit.super__Optional_base<int,_true,_true>._M_payload.
                 super__Optional_payload_base<int>._M_payload;
    Eigen::DenseBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::Zero
              ((ConstantReturnType *)local_130,local_290,cols);
    Eigen::PlainObjectBase<Eigen::Matrix<float,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,_1,0,_1,_1>>>
              ((PlainObjectBase<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)&V_hat_h,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>
                *)local_130);
    lVar9 = 0;
    local_288 = 0;
    if (0 < (int)uVar8) {
      local_288 = uVar8 & 0xffffffff;
    }
    local_278 = local_288 * 4;
    for (; local_278 != lVar9; lVar9 = lVar9 + 4) {
      morphablemodel::PcaModel::get_rescaled_pca_basis_at_point
                (&rhs,shape_model,
                 *(int *)((long)(vertex_ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_start + lVar9));
      Eigen::DenseBase<Eigen::Matrix<float,-1,-1,0,-1,-1>>::block<long,int>
                ((Type *)local_130,&rhs,0,0,
                 rhs.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
                 m_rows,num_coefficients_to_fit.super__Optional_base<int,_true,_true>._M_payload.
                        super__Optional_payload_base<int>._M_payload);
      Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>::Block
                ((Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false> *)&P,
                 (Matrix<float,__1,__1,_0,__1,__1> *)&V_hat_h,lVar9,0,3,
                 V_hat_h.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
                 m_cols);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>const,_1,_1,false>>
                ((Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false> *)&P,
                 (Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false> *)local_130);
      free(rhs.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_data);
    }
    lVar9 = (long)(uVar8 * 0x300000000) >> 0x20;
    Eigen::SparseMatrix<float,_0,_int>::SparseMatrix(&P,lVar9,local_290);
    P_coefficients.
    super__Vector_base<Eigen::Triplet<float,_int>,_std::allocator<Eigen::Triplet<float,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    P_coefficients.
    super__Vector_base<Eigen::Triplet<float,_int>,_std::allocator<Eigen::Triplet<float,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    P_coefficients.
    super__Vector_base<Eigen::Triplet<float,_int>,_std::allocator<Eigen::Triplet<float,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    uVar8 = 0;
    while( true ) {
      pvVar4 = local_280;
      uVar3 = local_288;
      if (uVar8 == local_288) break;
      for (row = 0; row != 3; row = row + 1) {
        for (col = 0; col != 4; col = col + 1) {
          pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>,_1> *)
                              affine_camera_matrix,row,col);
          auVar5 = local_130._0_16_;
          local_130._4_4_ = (uint)col | (int)uVar8 * 4;
          local_130._0_4_ = (int)row + (int)uVar8 * 3;
          local_130._12_4_ = auVar5._12_4_;
          local_130._8_4_ = *pSVar6;
          std::vector<Eigen::Triplet<float,int>,std::allocator<Eigen::Triplet<float,int>>>::
          emplace_back<Eigen::Triplet<float,int>>
                    ((vector<Eigen::Triplet<float,int>,std::allocator<Eigen::Triplet<float,int>>> *)
                     &P_coefficients,(Triplet<float,_int> *)local_130);
        }
      }
      uVar8 = uVar8 + 1;
    }
    local_130._0_8_ =
         P_coefficients.
         super__Vector_base<Eigen::Triplet<float,_int>,_std::allocator<Eigen::Triplet<float,_int>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    rhs.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_data =
         (float *)P_coefficients.
                  super__Vector_base<Eigen::Triplet<float,_int>,_std::allocator<Eigen::Triplet<float,_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    Eigen::SparseMatrix<float,0,int>::
    setFromTriplets<__gnu_cxx::__normal_iterator<Eigen::Triplet<float,int>*,std::vector<Eigen::Triplet<float,int>,std::allocator<Eigen::Triplet<float,int>>>>>
              ((SparseMatrix<float,0,int> *)&P,
               (__normal_iterator<Eigen::Triplet<float,_int>_*,_std::vector<Eigen::Triplet<float,_int>,_std::allocator<Eigen::Triplet<float,_int>_>_>_>
                *)local_130,
               (__normal_iterator<Eigen::Triplet<float,_int>_*,_std::vector<Eigen::Triplet<float,_int>,_std::allocator<Eigen::Triplet<float,_int>_>_>_>
                *)&rhs);
    if (((ulong)detector_standard_deviation.super__Optional_base<float,_true,_true>._M_payload.
                super__Optional_payload_base<float> & 0x100000000) == 0) {
      dVar2 = 1.7320507764816284;
    }
    else {
      dVar2 = (double)detector_standard_deviation.super__Optional_base<float,_true,_true>._M_payload
                      .super__Optional_payload_base<float>._M_payload._M_value;
    }
    dVar10 = 0.0;
    if (((ulong)model_standard_deviation.super__Optional_base<float,_true,_true>._M_payload.
                super__Optional_payload_base<float> & 0x100000000) != 0) {
      dVar10 = (double)model_standard_deviation.super__Optional_base<float,_true,_true>._M_payload.
                       super__Optional_payload_base<float>._M_payload._M_value;
    }
    rhs.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_data._0_4_ =
         1.0 / (float)(dVar2 * dVar2 + dVar10 * dVar10);
    Eigen::DenseBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::Constant
              ((DenseBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)local_130,lVar9,(Scalar *)&rhs);
    Eigen::PlainObjectBase<Eigen::Matrix<float,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,_1,1>>>
              ((PlainObjectBase<Eigen::Matrix<float,_1,1,0,_1,1>> *)&Omega,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
                *)local_130);
    Eigen::DenseBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::Ones
              ((DenseBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)local_130,lVar9);
    Eigen::PlainObjectBase<Eigen::Matrix<float,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,_1,1>>>
              ((PlainObjectBase<Eigen::Matrix<float,_1,1,0,_1,1>> *)&y,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
                *)local_130);
    lVar9 = 0;
    for (uVar8 = 0; uVar3 != uVar8; uVar8 = uVar8 + 1) {
      SVar1 = (pvVar4->
              super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
              )._M_impl.super__Vector_impl_data._M_start[uVar8].
              super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0];
      pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_1> *)&y,lVar9);
      *pSVar7 = SVar1;
      SVar1 = *(float *)((long)&(pvVar4->
                                super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                                )._M_impl.super__Vector_impl_data._M_start[uVar8].
                                super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.
                                m_storage.m_data + 4);
      pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_1> *)&y,lVar9 + 1)
      ;
      *pSVar7 = SVar1;
      lVar9 = lVar9 + 3;
    }
    Eigen::DenseBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::Ones
              ((DenseBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)local_130,local_290);
    Eigen::PlainObjectBase<Eigen::Matrix<float,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,_1,1>>>
              ((PlainObjectBase<Eigen::Matrix<float,_1,1,0,_1,1>> *)&v_bar,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
                *)local_130);
    for (lVar9 = 0; local_278 != lVar9; lVar9 = lVar9 + 4) {
      pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_1> *)base_face,
                          (long)*(int *)((long)(vertex_ids->
                                               super__Vector_base<int,_std::allocator<int>_>).
                                               _M_impl.super__Vector_impl_data._M_start + lVar9) * 3
                         );
      SVar1 = *pSVar7;
      pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_1> *)&v_bar,lVar9)
      ;
      *pSVar7 = SVar1;
      pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_1> *)base_face,
                          (long)*(int *)((long)(vertex_ids->
                                               super__Vector_base<int,_std::allocator<int>_>).
                                               _M_impl.super__Vector_impl_data._M_start + lVar9) * 3
                          + 1);
      SVar1 = *pSVar7;
      pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_1> *)&v_bar,
                          lVar9 + 1);
      *pSVar7 = SVar1;
      pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_1> *)base_face,
                          (long)*(int *)((long)(vertex_ids->
                                               super__Vector_base<int,_std::allocator<int>_>).
                                               _M_impl.super__Vector_impl_data._M_start + lVar9) * 3
                          + 2);
      SVar1 = *pSVar7;
      pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_1> *)&v_bar,
                          lVar9 + 2);
      *pSVar7 = SVar1;
    }
    local_130._0_16_ =
         (undefined1  [16])
         Eigen::SparseMatrixBase<Eigen::SparseMatrix<float,0,int>>::operator*
                   ((SparseMatrixBase<Eigen::SparseMatrix<float,0,int>> *)&P,
                    (MatrixBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)&V_hat_h);
    Eigen::PlainObjectBase<Eigen::Matrix<float,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::Product<Eigen::SparseMatrix<float,0,int>,Eigen::Matrix<float,_1,_1,0,_1,_1>,0>>
              ((PlainObjectBase<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)&A,
               (DenseBase<Eigen::Product<Eigen::SparseMatrix<float,_0,_int>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0>_>
                *)local_130);
    rhs.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage._0_16_ =
         Eigen::SparseMatrixBase<Eigen::SparseMatrix<float,0,int>>::operator*
                   ((SparseMatrixBase<Eigen::SparseMatrix<float,0,int>> *)&P,
                    (MatrixBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)&v_bar);
    Eigen::
    MatrixBase<Eigen::Product<Eigen::SparseMatrix<float,0,int>,Eigen::Matrix<float,-1,1,0,-1,1>,0>>
    ::operator-((CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Product<Eigen::SparseMatrix<float,_0,_int>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
                 *)local_130,
                (MatrixBase<Eigen::Product<Eigen::SparseMatrix<float,0,int>,Eigen::Matrix<float,_1,1,0,_1,1>,0>>
                 *)&rhs,(MatrixBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)&y);
    Eigen::PlainObjectBase<Eigen::Matrix<float,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,float>,Eigen::Product<Eigen::SparseMatrix<float,0,int>,Eigen::Matrix<float,_1,1,0,_1,1>,0>const,Eigen::Matrix<float,_1,1,0,_1,1>const>>
              ((PlainObjectBase<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)&b,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Product<Eigen::SparseMatrix<float,_0,_int>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
                *)local_130);
    local_98 = (PlainObjectBase<Eigen::Matrix<float,_1,1,0,_1,1>> *)&Omega;
    local_90 = (PlainObjectBase<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)&A;
    local_88 = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<float,-1,-1,0,-1,-1>const>>::
               operator*((MatrixBase<Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>const>> *)
                         &local_90,
                         (DiagonalBase<Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
                          *)&local_98);
    Eigen::
    Product<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>,_1>,_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0>
    ::Product((Product<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0>
               *)&c_s,&local_88,(Rhs *)&A);
    Eigen::MatrixBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::Identity(&local_190,cols,cols);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>
                      *)&rhs,&lambda_local,(StorageBaseType *)&local_190);
    Eigen::
    MatrixBase<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,-1,-1,0,-1,-1>const>,Eigen::DiagonalWrapper<Eigen::Matrix<float,-1,1,0,-1,1>const>,1>,Eigen::Matrix<float,-1,-1,0,-1,-1>,0>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::Product<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>_>
                 *)local_130,
                (MatrixBase<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>const>,Eigen::DiagonalWrapper<Eigen::Matrix<float,_1,1,0,_1,1>const>,1>,Eigen::Matrix<float,_1,_1,0,_1,_1>,0>>
                 *)&c_s,(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>_>
                         *)&rhs);
    Eigen::PlainObjectBase<Eigen::Matrix<float,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,float>,Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>const>,Eigen::DiagonalWrapper<Eigen::Matrix<float,_1,1,0,_1,1>const>,1>,Eigen::Matrix<float,_1,_1,0,_1,_1>,0>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,_1,0,_1,_1>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,Eigen::Matrix<float,_1,_1,0,_1,_1>>const>const>>
              ((PlainObjectBase<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)&AtOmegaAReg,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::Product<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>_>_>
                *)local_130);
    local_190.m_rows.m_value = (long)&A;
    local_88.m_lhs.m_matrix = (non_const_type)&Omega;
    Eigen::
    Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Transpose<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>,_1>
    ::Product((Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>
               *)&c_s,(Lhs *)&local_190,(Rhs *)&local_88);
    Eigen::
    Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Transpose<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>,_1>,_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0>
    ::Product((Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0>
               *)local_130,(Lhs *)&c_s,&b);
    Eigen::PlainObjectBase<Eigen::Matrix<float,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>const>const>,Eigen::DiagonalWrapper<Eigen::Matrix<float,_1,1,0,_1,1>const>,1>,Eigen::Matrix<float,_1,_1,0,_1,_1>,0>>
              ((PlainObjectBase<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)&rhs,
               (DenseBase<Eigen::Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0>_>
                *)local_130);
    Eigen::ColPivHouseholderQR<Eigen::Matrix<float,-1,-1,0,-1,-1>>::
    ColPivHouseholderQR<Eigen::Matrix<float,_1,_1,0,_1,_1>>
              ((ColPivHouseholderQR<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)local_130,
               (EigenBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)&AtOmegaAReg);
    local_190._0_16_ =
         Eigen::SolverBase<Eigen::ColPivHouseholderQR<Eigen::Matrix<float,-1,-1,0,-1,-1>>>::
         solve<Eigen::Matrix<float,_1,_1,0,_1,_1>>
                   ((SolverBase<Eigen::ColPivHouseholderQR<Eigen::Matrix<float,_1,_1,0,_1,_1>>> *)
                    local_130,(MatrixBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)&rhs);
    Eigen::PlainObjectBase<Eigen::Matrix<float,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<float,_1,_1,0,_1,_1>>,Eigen::Matrix<float,_1,_1,0,_1,_1>>>
              ((PlainObjectBase<Eigen::Matrix<float,_1,1,0,_1,1>> *)&c_s,
               (DenseBase<Eigen::Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>
                *)&local_190);
    Eigen::ColPivHouseholderQR<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::~ColPivHouseholderQR
              ((ColPivHouseholderQR<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)local_130);
    std::vector<float,std::allocator<float>>::vector<float_const*,void>
              ((vector<float,std::allocator<float>> *)__return_storage_ptr__,
               c_s.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_data,
               c_s.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_data +
               c_s.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
               (allocator_type *)local_130);
    free(c_s.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    free(rhs.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_data);
    free(AtOmegaAReg.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
         m_data);
    free(b.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_data);
    free(A.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_data);
    free(v_bar.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    free(y.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    free(Omega.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    std::_Vector_base<Eigen::Triplet<float,_int>,_std::allocator<Eigen::Triplet<float,_int>_>_>::
    ~_Vector_base(&P_coefficients.
                   super__Vector_base<Eigen::Triplet<float,_int>,_std::allocator<Eigen::Triplet<float,_int>_>_>
                 );
    Eigen::SparseMatrix<float,_0,_int>::~SparseMatrix(&P);
    free(V_hat_h.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_data);
    return __return_storage_ptr__;
  }
  __assert_fail("landmarks.size() == vertex_ids.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/include/eos/fitting/linear_shape_fitting.hpp"
                ,0x44,
                "std::vector<float> eos::fitting::fit_shape_to_landmarks_linear(const morphablemodel::PcaModel &, Eigen::Matrix<float, 3, 4>, const std::vector<Eigen::Vector2f> &, const std::vector<int> &, Eigen::VectorXf, float, cpp17::optional<int>, cpp17::optional<float>, cpp17::optional<float>)"
               );
}

Assistant:

inline std::vector<float> fit_shape_to_landmarks_linear(
    const morphablemodel::PcaModel& shape_model, Eigen::Matrix<float, 3, 4> affine_camera_matrix,
    const std::vector<Eigen::Vector2f>& landmarks, const std::vector<int>& vertex_ids,
    Eigen::VectorXf base_face = Eigen::VectorXf(), float lambda = 3.0f,
    cpp17::optional<int> num_coefficients_to_fit = cpp17::optional<int>(),
    cpp17::optional<float> detector_standard_deviation = cpp17::optional<float>(),
    cpp17::optional<float> model_standard_deviation = cpp17::optional<float>())
{
    assert(landmarks.size() == vertex_ids.size());

    using Eigen::VectorXf;
    using Eigen::MatrixXf;

    const int num_coeffs_to_fit = num_coefficients_to_fit.value_or(shape_model.get_num_principal_components());
    const int num_landmarks = static_cast<int>(landmarks.size());

    if (base_face.size() == 0)
    {
        base_face = shape_model.get_mean();
    }

    // $\hat{V} \in R^{3N\times m-1}$, subselect the rows of the eigenvector matrix $V$ associated with the $N$ feature points
    // And we insert a row of zeros after every third row, resulting in matrix $\hat{V}_h \in R^{4N\times m-1}$:
    MatrixXf V_hat_h = MatrixXf::Zero(4 * num_landmarks, num_coeffs_to_fit);
    int row_index = 0;
    for (int i = 0; i < num_landmarks; ++i)
    {
        // In the paper, I'm not sure whether they use the orthonormal basis. It seems a bit messy/inconsistent even in the paper.
        // Update PH 26.5.2014: I think the rescaled basis is fine/better!
        const auto& basis_rows = shape_model.get_rescaled_pca_basis_at_point(vertex_ids[i]);
        V_hat_h.block(row_index, 0, 3, V_hat_h.cols()) =
            basis_rows.block(0, 0, basis_rows.rows(), num_coeffs_to_fit);
        row_index += 4; // replace 3 rows and skip the 4th one, it has all zeros
    }

    // Form a block diagonal matrix $P \in R^{3N\times 4N}$ in which the camera matrix C (P_Affine, affine_camera_matrix) is placed on the diagonal:
    Eigen::SparseMatrix<float> P(3 * num_landmarks, 4 * num_landmarks);
    std::vector<Eigen::Triplet<float>> P_coefficients; // list of non-zeros coefficients
    for (int i = 0; i < num_landmarks; ++i) { // Note: could make this the inner-most loop.
        for (int x = 0; x < affine_camera_matrix.rows(); ++x) {
            for (int y = 0; y < affine_camera_matrix.cols(); ++y) {
                P_coefficients.push_back(
                    Eigen::Triplet<float>(3 * i + x, 4 * i + y, affine_camera_matrix(x, y)));
            }
        }
    }
    P.setFromTriplets(P_coefficients.begin(), P_coefficients.end());

    // The variances: Add the 2D and 3D standard deviations.
    // If the user doesn't provide them, we choose the following:
    // 2D (detector) standard deviation: In pixel, we follow [1] and choose sqrt(3) as the default value.
    // 3D (model) variance: 0.0f. It only makes sense to set it to something when we have a different variance
    // for different vertices.
    // The 3D variance has to be projected to 2D (for details, see paper [1]) so the units do match up.
    const float sigma_squared_2D = std::pow(detector_standard_deviation.value_or(std::sqrt(3.0f)), 2) +
                                   std::pow(model_standard_deviation.value_or(0.0f), 2);
    // We use a VectorXf, and later use .asDiagonal():
    const VectorXf Omega = VectorXf::Constant(3 * num_landmarks, 1.0f / sigma_squared_2D);
    // Earlier, we set Sigma in a for-loop and then computed Omega, but it was really unnecessary:
    // Sigma(i, i) = sqrt(sigma_squared_2D), but then Omega is Sigma.t() * Sigma (squares the diagonal) - so
    // we just assign 1/sigma_squared_2D to Omega here.

    // The landmarks in matrix notation (in homogeneous coordinates), $3N\times 1$
    VectorXf y = VectorXf::Ones(3 * num_landmarks);
    for (int i = 0; i < num_landmarks; ++i)
    {
        y(3 * i) = landmarks[i][0];
        y((3 * i) + 1) = landmarks[i][1];
        // y((3 * i) + 2) = 1; // already 1, stays (homogeneous coordinate)
    }

    // The mean, with an added homogeneous coordinate (x_1, y_1, z_1, 1, x_2, ...)^t
    VectorXf v_bar = VectorXf::Ones(4 * num_landmarks);
    for (int i = 0; i < num_landmarks; ++i)
    {
        v_bar(4 * i) = base_face(vertex_ids[i] * 3);
        v_bar((4 * i) + 1) = base_face(vertex_ids[i] * 3 + 1);
        v_bar((4 * i) + 2) = base_face(vertex_ids[i] * 3 + 2);
        // v_bar((4 * i) + 3) = 1; // already 1, stays (homogeneous coordinate)
    }

    // Bring into standard regularised quadratic form with diagonal distance matrix Omega:
    const MatrixXf A = P * V_hat_h; // camera matrix times the basis
    const MatrixXf b = P * v_bar - y; // camera matrix times the mean, minus the landmarks
    const MatrixXf AtOmegaAReg = A.transpose() * Omega.asDiagonal() * A +
                                 lambda * Eigen::MatrixXf::Identity(num_coeffs_to_fit, num_coeffs_to_fit);
    const MatrixXf rhs = -A.transpose() * Omega.asDiagonal() * b; // It's -A^t*Omega^t*b, but we don't need to
                                                                  // transpose Omega, since it's a diagonal
                                                                  // matrix, and Omega^t = Omega.

    // c_s: The 'x' that we solve for. (The variance-normalised shape parameter vector, $c_s =
    // [a_1/sigma_{s,1} , ..., a_m-1/sigma_{s,m-1}]^t$.)
    // We get coefficients ~ N(0, 1), because we're fitting with the rescaled basis. The coefficients are not
    // multiplied with their eigenvalues.
    const VectorXf c_s = AtOmegaAReg.colPivHouseholderQr().solve(rhs);

    return std::vector<float>(c_s.data(), c_s.data() + c_s.size());
}